

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O0

int VP8GetHeaders(VP8Decoder *dec,VP8Io *io)

{
  uint3 *puVar1;
  uint3 uVar2;
  uint uVar3;
  uint32_t uVar4;
  VP8StatusCode error;
  uint8_t *data;
  ulong uVar5;
  VP8BitReader *br_00;
  VP8Decoder *dec_00;
  uint *in_RSI;
  VP8Decoder *in_RDI;
  uint32_t bits;
  VP8StatusCode status;
  VP8BitReader *br;
  VP8PictureHeader *pic_hdr;
  VP8FrameHeader *frm_hdr;
  size_t buf_size;
  uint8_t *buf;
  int in_stack_ffffffffffffffbc;
  VP8BitReader *br_01;
  VP8Decoder *dec_01;
  VP8Proba *proba;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar6;
  
  if (in_RDI == (VP8Decoder *)0x0) {
    iVar6 = 0;
  }
  else {
    SetOk(in_RDI);
    if (in_RSI == (uint *)0x0) {
      iVar6 = VP8SetError(in_RDI,VP8_STATUS_INVALID_PARAM,"null VP8Io passed to VP8GetHeaders()");
    }
    else {
      puVar1 = *(uint3 **)(in_RSI + 0x1a);
      uVar5 = *(ulong *)(in_RSI + 0x18);
      if (uVar5 < 4) {
        iVar6 = VP8SetError(in_RDI,VP8_STATUS_NOT_ENOUGH_DATA,"Truncated header.");
      }
      else {
        uVar2 = *puVar1;
        uVar3 = (uint)uVar2;
        proba = (VP8Proba *)&in_RDI->frm_hdr_;
        ((VP8FrameHeader *)proba)->key_frame_ = ((uVar2 & 1) != 0 ^ 0xffU) & 1;
        (in_RDI->frm_hdr_).profile_ = (byte)(uVar2 >> 1) & 7;
        (in_RDI->frm_hdr_).show_ = (byte)(uVar2 >> 4) & 1;
        (in_RDI->frm_hdr_).partition_length_ = (uint)(uVar2 >> 5);
        if ((in_RDI->frm_hdr_).profile_ < 4) {
          if ((in_RDI->frm_hdr_).show_ == '\0') {
            iVar6 = VP8SetError(in_RDI,VP8_STATUS_UNSUPPORTED_FEATURE,"Frame not displayable.");
          }
          else {
            data = (uint8_t *)((long)puVar1 + 3);
            uVar5 = uVar5 - 3;
            dec_01 = (VP8Decoder *)&in_RDI->pic_hdr_;
            if (((VP8FrameHeader *)proba)->key_frame_ != '\0') {
              if (uVar5 < 7) {
                iVar6 = VP8SetError(in_RDI,VP8_STATUS_NOT_ENOUGH_DATA,"cannot parse picture header")
                ;
                return iVar6;
              }
              iVar6 = VP8CheckSignature(data,uVar5);
              if (iVar6 == 0) {
                iVar6 = VP8SetError(in_RDI,VP8_STATUS_BITSTREAM_ERROR,"Bad code word");
                return iVar6;
              }
              *(undefined2 *)&dec_01->status_ = *(undefined2 *)(data + 3) & 0x3fff;
              *(uint8_t *)&dec_01->ready_ = (uint8_t)((int)(uint)data[4] >> 6);
              *(ushort *)((long)&dec_01->status_ + 2) = *(ushort *)(data + 5) & 0x3fff;
              *(uint8_t *)((long)&dec_01->ready_ + 1) = (uint8_t)((int)(uint)data[6] >> 6);
              data = data + 7;
              uVar5 = uVar5 - 7;
              in_RDI->mb_w_ = (int)((ushort)(short)dec_01->status_ + 0xf) >> 4;
              in_RDI->mb_h_ = (int)(*(uint16_t *)((long)&dec_01->status_ + 2) + 0xf) >> 4;
              *in_RSI = (uint)(ushort)(short)dec_01->status_;
              in_RSI[1] = (uint)*(uint16_t *)((long)&dec_01->status_ + 2);
              in_RSI[0x1d] = 0;
              in_RSI[0x20] = 0;
              in_RSI[0x1e] = 0;
              in_RSI[0x1f] = *in_RSI;
              in_RSI[0x21] = in_RSI[1];
              in_RSI[0x22] = 0;
              in_RSI[0x23] = *in_RSI;
              in_RSI[0x24] = in_RSI[1];
              in_RSI[3] = *in_RSI;
              in_RSI[4] = in_RSI[1];
              VP8ResetProba((VP8Proba *)0x10bd6b);
              ResetSegmentHeader((VP8SegmentHeader *)0x10bd7c);
            }
            if (uVar5 < *(uint *)(proba->bands_[0][0].probas_[0] + 1)) {
              iVar6 = VP8SetError(in_RDI,VP8_STATUS_NOT_ENOUGH_DATA,"bad partition length");
            }
            else {
              br_01 = &in_RDI->br_;
              VP8InitBitReader(br_01,(uint8_t *)CONCAT44(in_stack_ffffffffffffffbc,uVar3),0x10bdd1);
              br_00 = (VP8BitReader *)(data + *(uint *)(proba->bands_[0][0].probas_[0] + 1));
              dec_00 = (VP8Decoder *)(uVar5 - *(uint *)(proba->bands_[0][0].probas_[0] + 1));
              if (proba->segments_[0] != '\0') {
                uVar4 = VP8GetValue(br_01,in_stack_ffffffffffffffbc);
                *(uint8_t *)((long)&dec_01->ready_ + 2) = (uint8_t)uVar4;
                uVar4 = VP8GetValue(br_01,in_stack_ffffffffffffffbc);
                *(uint8_t *)((long)&dec_01->ready_ + 3) = (uint8_t)uVar4;
              }
              iVar6 = ParseSegmentHeader(br_00,(VP8SegmentHeader *)dec_00,proba);
              if (iVar6 == 0) {
                iVar6 = VP8SetError(in_RDI,VP8_STATUS_BITSTREAM_ERROR,"cannot parse segment header")
                ;
              }
              else {
                iVar6 = ParseFilterHeader((VP8BitReader *)proba,dec_01);
                if (iVar6 == 0) {
                  iVar6 = VP8SetError(in_RDI,VP8_STATUS_BITSTREAM_ERROR,"cannot parse filter header"
                                     );
                }
                else {
                  error = ParsePartitions((VP8Decoder *)br,(uint8_t *)_bits,
                                          CONCAT44(in_stack_fffffffffffffffc,
                                                   in_stack_fffffffffffffff8));
                  if (error == VP8_STATUS_OK) {
                    VP8ParseQuant(_bits);
                    if (proba->segments_[0] == '\0') {
                      iVar6 = VP8SetError(in_RDI,VP8_STATUS_UNSUPPORTED_FEATURE,"Not a key frame.");
                    }
                    else {
                      VP8GetValue(br_01,error);
                      VP8ParseProba(br_00,dec_00);
                      in_RDI->ready_ = 1;
                      iVar6 = 1;
                    }
                  }
                  else {
                    iVar6 = VP8SetError(in_RDI,error,"cannot parse partitions");
                  }
                }
              }
            }
          }
        }
        else {
          iVar6 = VP8SetError(in_RDI,VP8_STATUS_BITSTREAM_ERROR,"Incorrect keyframe parameters.");
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int VP8GetHeaders(VP8Decoder* const dec, VP8Io* const io) {
  const uint8_t* buf;
  size_t buf_size;
  VP8FrameHeader* frm_hdr;
  VP8PictureHeader* pic_hdr;
  VP8BitReader* br;
  VP8StatusCode status;

  if (dec == NULL) {
    return 0;
  }
  SetOk(dec);
  if (io == NULL) {
    return VP8SetError(dec, VP8_STATUS_INVALID_PARAM,
                       "null VP8Io passed to VP8GetHeaders()");
  }
  buf = io->data;
  buf_size = io->data_size;
  if (buf_size < 4) {
    return VP8SetError(dec, VP8_STATUS_NOT_ENOUGH_DATA,
                       "Truncated header.");
  }

  // Paragraph 9.1
  {
    const uint32_t bits = buf[0] | (buf[1] << 8) | (buf[2] << 16);
    frm_hdr = &dec->frm_hdr_;
    frm_hdr->key_frame_ = !(bits & 1);
    frm_hdr->profile_ = (bits >> 1) & 7;
    frm_hdr->show_ = (bits >> 4) & 1;
    frm_hdr->partition_length_ = (bits >> 5);
    if (frm_hdr->profile_ > 3) {
      return VP8SetError(dec, VP8_STATUS_BITSTREAM_ERROR,
                         "Incorrect keyframe parameters.");
    }
    if (!frm_hdr->show_) {
      return VP8SetError(dec, VP8_STATUS_UNSUPPORTED_FEATURE,
                         "Frame not displayable.");
    }
    buf += 3;
    buf_size -= 3;
  }

  pic_hdr = &dec->pic_hdr_;
  if (frm_hdr->key_frame_) {
    // Paragraph 9.2
    if (buf_size < 7) {
      return VP8SetError(dec, VP8_STATUS_NOT_ENOUGH_DATA,
                         "cannot parse picture header");
    }
    if (!VP8CheckSignature(buf, buf_size)) {
      return VP8SetError(dec, VP8_STATUS_BITSTREAM_ERROR,
                         "Bad code word");
    }
    pic_hdr->width_ = ((buf[4] << 8) | buf[3]) & 0x3fff;
    pic_hdr->xscale_ = buf[4] >> 6;   // ratio: 1, 5/4 5/3 or 2
    pic_hdr->height_ = ((buf[6] << 8) | buf[5]) & 0x3fff;
    pic_hdr->yscale_ = buf[6] >> 6;
    buf += 7;
    buf_size -= 7;

    dec->mb_w_ = (pic_hdr->width_ + 15) >> 4;
    dec->mb_h_ = (pic_hdr->height_ + 15) >> 4;

    // Setup default output area (can be later modified during io->setup())
    io->width = pic_hdr->width_;
    io->height = pic_hdr->height_;
    // IMPORTANT! use some sane dimensions in crop_* and scaled_* fields.
    // So they can be used interchangeably without always testing for
    // 'use_cropping'.
    io->use_cropping = 0;
    io->crop_top  = 0;
    io->crop_left = 0;
    io->crop_right  = io->width;
    io->crop_bottom = io->height;
    io->use_scaling  = 0;
    io->scaled_width = io->width;
    io->scaled_height = io->height;

    io->mb_w = io->width;   // for soundness
    io->mb_h = io->height;  // ditto

    VP8ResetProba(&dec->proba_);
    ResetSegmentHeader(&dec->segment_hdr_);
  }

  // Check if we have all the partition #0 available, and initialize dec->br_
  // to read this partition (and this partition only).
  if (frm_hdr->partition_length_ > buf_size) {
    return VP8SetError(dec, VP8_STATUS_NOT_ENOUGH_DATA,
                       "bad partition length");
  }

  br = &dec->br_;
  VP8InitBitReader(br, buf, frm_hdr->partition_length_);
  buf += frm_hdr->partition_length_;
  buf_size -= frm_hdr->partition_length_;

  if (frm_hdr->key_frame_) {
    pic_hdr->colorspace_ = VP8Get(br, "global-header");
    pic_hdr->clamp_type_ = VP8Get(br, "global-header");
  }
  if (!ParseSegmentHeader(br, &dec->segment_hdr_, &dec->proba_)) {
    return VP8SetError(dec, VP8_STATUS_BITSTREAM_ERROR,
                       "cannot parse segment header");
  }
  // Filter specs
  if (!ParseFilterHeader(br, dec)) {
    return VP8SetError(dec, VP8_STATUS_BITSTREAM_ERROR,
                       "cannot parse filter header");
  }
  status = ParsePartitions(dec, buf, buf_size);
  if (status != VP8_STATUS_OK) {
    return VP8SetError(dec, status, "cannot parse partitions");
  }

  // quantizer change
  VP8ParseQuant(dec);

  // Frame buffer marking
  if (!frm_hdr->key_frame_) {
    return VP8SetError(dec, VP8_STATUS_UNSUPPORTED_FEATURE,
                       "Not a key frame.");
  }

  VP8Get(br, "global-header");   // ignore the value of update_proba_

  VP8ParseProba(br, dec);

  // sanitized state
  dec->ready_ = 1;
  return 1;
}